

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

void av1_pick_filter_restoration(YV12_BUFFER_CONFIG *src,AV1_COMP *cpi)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint8_t uVar3;
  BLOCK_SIZE bsize;
  RestorationType RVar4;
  RefCntBuffer *pRVar5;
  SequenceHeader *pSVar6;
  RestUnitSearchInfo *pRVar7;
  double dVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  AV1_COMMON *cm;
  YV12_BUFFER_CONFIG *pYVar12;
  int plane_1;
  int iVar13;
  int iVar14;
  int iVar15;
  RestorationUnitInfo *pRVar16;
  void *__s;
  int16_t *__s_00;
  int iVar17;
  RestorationType r;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  char *pcVar22;
  int plane;
  size_t size;
  int plane_2;
  ulong uVar23;
  RestorationInfo *pRVar24;
  long lVar25;
  bool bVar26;
  double dVar27;
  uint local_26c;
  char local_268 [4];
  uint local_264;
  uint local_260;
  int plane_h_1;
  AV1_COMMON *local_258;
  ulong local_250;
  int local_248;
  uint local_244;
  int plane_w_1;
  int local_23c;
  int local_238;
  int local_234;
  ulong local_230;
  SequenceHeader *local_228;
  ulong local_220;
  int plane_h;
  undefined4 local_210;
  long local_208;
  RestorationInfo *local_200;
  RestorationInfo *local_1f8;
  uint local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int rrow1;
  int rrow0;
  int rcol1;
  int rcol0;
  int plane_h_2;
  ulong local_1b8;
  long local_1b0;
  double local_1a8;
  ThreadData_conflict *local_1a0;
  YV12_BUFFER_CONFIG *local_198;
  LOOP_FILTER_SPEED_FEATURES *local_190;
  YV12_BUFFER_CONFIG *local_188;
  long local_180;
  long local_178;
  long local_170;
  int plane_w;
  YV12_BUFFER_CONFIG *local_160;
  AV1_COMMON *local_158;
  ThreadData_conflict *local_150;
  undefined4 local_148;
  int local_144;
  int local_140;
  RestUnitSearchInfo *local_138;
  LOOP_FILTER_SPEED_FEATURES *local_130;
  uint8_t *local_128;
  undefined4 local_120;
  uint8_t *local_118;
  undefined4 local_110;
  undefined1 local_f0;
  long local_e8 [9];
  undefined2 local_a0;
  undefined4 local_9e;
  undefined8 local_98;
  undefined2 local_90;
  undefined4 local_8e;
  undefined8 local_84;
  undefined8 local_78;
  undefined2 local_70;
  undefined4 local_6e;
  undefined8 local_68;
  undefined2 local_60;
  undefined4 local_5e;
  undefined8 local_54;
  int16_t *local_48;
  int16_t *piStack_40;
  
  local_258 = &cpi->common;
  local_228 = (cpi->common).seq_params;
  local_190 = &(cpi->sf).lpf_sf;
  uVar3 = local_228->monochrome;
  local_220 = CONCAT71(local_220._1_7_,uVar3);
  local_264 = (uint)local_228->use_highbitdepth;
  local_188 = src;
  av1_fill_lr_rates(&(cpi->td).mb.mode_costs,(cpi->td).mb.e_mbd.tile_ctx);
  uVar18 = (cpi->sf).lpf_sf.min_lr_unit_size;
  uVar21 = (cpi->sf).lpf_sf.max_lr_unit_size;
  local_260 = (uint)block_size_wide[((cpi->common).seq_params)->sb_size];
  if ((int)(uint)block_size_wide[((cpi->common).seq_params)->sb_size] < (int)uVar18) {
    local_260 = uVar18;
  }
  local_200 = (cpi->common).rst_info;
  local_208 = (ulong)(uVar3 == '\0') * 2 + 1;
  iVar15 = (int)local_208;
  for (uVar23 = 0; pRVar24 = local_200, (uint)(iVar15 * 8) != uVar23; uVar23 = uVar23 + 8) {
    av1_get_upsampled_plane_size(local_258,(uint)(uVar23 != 0),&plane_w,&plane_w_1);
    uVar18 = local_260;
    iVar13 = av1_lr_count_units(local_260,plane_w);
    iVar14 = av1_lr_count_units(uVar18,plane_w_1);
    aom_free((&(cpi->common).rst_info[0].unit_info)[uVar23]);
    size = (long)(iVar14 * iVar13) << 6;
    pRVar16 = (RestorationUnitInfo *)aom_memalign(0x10,size);
    (&(cpi->common).rst_info[0].unit_info)[uVar23] = pRVar16;
    if (pRVar16 == (RestorationUnitInfo *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate rsi->unit_info"
                        );
    }
    __s = aom_memalign(0x10,size);
    if (__s == (void *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate rusi");
    }
    memset(__s,0,size);
    *(void **)((long)(cpi->pick_lr_ctxt).rusi + uVar23) = __s;
  }
  if ((int)uVar21 < (int)local_260) {
    uVar21 = local_260;
  }
  (cpi->td).mb.rdmult = (cpi->rd).RDMULT;
  local_198 = &cpi->trial_frame_rst;
  iVar15 = aom_realloc_frame_buffer
                     (local_198,(cpi->common).superres_upscaled_width,
                      (cpi->common).superres_upscaled_height,local_228->subsampling_x,
                      local_228->subsampling_y,local_264,0x20,(cpi->common).features.byte_alignment,
                      (aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,
                      false,0);
  if (iVar15 != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate trial restored frame buffer");
  }
  local_48 = (int16_t *)0x0;
  piStack_40 = (int16_t *)0x0;
  if (((cpi->sf).lpf_sf.disable_wiener_filter == false) && ((char)local_264 == '\0')) {
    __s_00 = (int16_t *)aom_memalign(0x20,0xc0000);
    (cpi->pick_lr_ctxt).dgd_avg = __s_00;
    if (__s_00 == (int16_t *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cpi->pick_lr_ctxt.dgd_avg");
      __s_00 = (cpi->pick_lr_ctxt).dgd_avg;
    }
    local_48 = __s_00;
    memset(__s_00,0,0xc0000);
    piStack_40 = __s_00 + 0x30000;
  }
  local_1a0 = &cpi->td;
  for (uVar23 = 0; (uint)((int)local_208 << 6) != uVar23; uVar23 = uVar23 + 0x40) {
    *(undefined4 *)((long)&pRVar24->frame_restoration_type + uVar23) = 0;
  }
  if ((char)local_220 == '\0') {
    local_230 = (ulong)((uint)((cpi->sf).lpf_sf.disable_loop_restoration_chroma == 0) * 2);
  }
  else {
    local_230 = 0;
  }
  uVar23 = (ulong)((cpi->sf).lpf_sf.disable_loop_restoration_luma != 0);
  local_268[1] = (cpi->sf).lpf_sf.disable_wiener_filter;
  local_268[2] = (cpi->sf).lpf_sf.disable_sgr_filter;
  local_268[0] = '\0';
  if ((_Bool)local_268[1] != false) {
    local_268[0] = local_268[2];
  }
  local_268[3] = 1;
  if ((_Bool)local_268[1] == false) {
    local_268[3] = local_268[2];
  }
  local_1b8 = uVar23;
  for (; uVar23 <= local_230; uVar23 = uVar23 + 1) {
    pRVar5 = (cpi->common).cur_frame;
    av1_get_upsampled_plane_size(local_258,(uint)(uVar23 != 0),&plane_w_1,&plane_h);
    av1_extend_frame((pRVar5->buf).store_buf_adr[uVar23 - 4],plane_w_1,plane_h,
                     *(int *)((long)(pRVar5->buf).store_buf_adr + (ulong)(uVar23 != 0) * 4 + -0x28),
                     3,3,local_264);
  }
  dVar8 = 1.79769313486232e+308;
  pRVar24 = local_200;
  local_26c = uVar21;
  for (; local_260 <= uVar21; uVar21 = uVar21 >> 1) {
    local_1a8 = dVar8;
    local_210 = 0;
    _plane_h = 0;
    lVar25 = 0;
    lVar19 = 0;
    local_1ec = uVar21;
    uVar23 = local_1b8;
    while (cm = local_258, uVar23 <= local_230) {
      local_1f8 = pRVar24 + uVar23;
      uVar18 = (uint)(uVar23 != 0);
      local_250 = uVar23;
      local_180 = lVar25;
      local_178 = lVar19;
      set_restoration_unit_size(local_258,local_1f8,uVar18,uVar21);
      pYVar12 = local_188;
      local_138 = (cpi->pick_lr_ctxt).rusi[local_250];
      _plane_w = local_188;
      local_160 = local_198;
      local_158 = cm;
      local_150 = local_1a0;
      local_148 = (undefined4)local_250;
      local_130 = local_190;
      pRVar5 = (cpi->common).cur_frame;
      av1_get_upsampled_plane_size(cm,uVar18,&plane_w_1,&plane_h_1);
      pRVar24 = local_1f8;
      uVar23 = (ulong)((uint)(uVar23 != 0) * 4);
      local_144 = plane_w_1;
      local_140 = plane_h_1;
      local_118 = pYVar12->store_buf_adr[local_250 - 4];
      local_110 = *(undefined4 *)((long)pYVar12->store_buf_adr + (uVar23 - 0x28));
      local_128 = (pRVar5->buf).store_buf_adr[local_250 - 4];
      local_120 = *(undefined4 *)((long)(pRVar5->buf).store_buf_adr + (uVar23 - 0x28));
      pSVar6 = (cpi->common).seq_params;
      bVar26 = false;
      if (local_250 != 0) {
        bVar26 = pSVar6->subsampling_y != 0;
      }
      bsize = pSVar6->sb_size;
      local_248 = pSVar6->mib_size_log2;
      local_220 = (ulong)(uint)local_1f8->restoration_unit_size;
      local_228 = (SequenceHeader *)
                  CONCAT44(local_228._4_4_,(local_1f8->restoration_unit_size * 3) / 2);
      av1_get_upsampled_plane_size(local_258,uVar18,&plane_h_1,&plane_h_2);
      iVar15 = pRVar24->num_rest_units;
      local_e8[6] = 0;
      local_e8[7] = 0;
      local_e8[4] = 0;
      local_e8[5] = 0;
      local_e8[2] = 0;
      local_e8[3] = 0;
      local_e8[0] = 0;
      local_e8[1] = 0;
      local_244 = 8 >> bVar26;
      local_1b0 = 0;
      while (lVar25 = local_180, uVar21 = local_1ec, pRVar24 = local_200,
            local_1b0 < (cpi->common).tiles.rows) {
        local_1e8 = (cpi->common).tiles.row_start_sb[local_1b0];
        local_1e0 = (cpi->common).tiles.row_start_sb[local_1b0 + 1];
        local_1b0 = local_1b0 + 1;
        lVar25 = 0;
        while (lVar25 < (cpi->common).tiles.cols) {
          local_1e4 = (cpi->common).tiles.col_start_sb[lVar25];
          local_1d4 = (cpi->common).tiles.col_start_sb[lVar25 + 1];
          local_170 = lVar25 + 1;
          local_98 = 0xffea000ffff90003;
          local_e8[8] = 0xffea000ffff90003;
          local_90 = 0xf;
          local_a0 = 0xf;
          local_8e = 0x3fff9;
          local_9e = 0x3fff9;
          local_84 = 0x1fffffffe0;
          local_68 = 0xffea000ffff90003;
          local_78 = 0xffea000ffff90003;
          local_60 = 0xf;
          local_70 = 0xf;
          local_5e = 0x3fff9;
          local_6e = 0x3fff9;
          local_54 = 0x1fffffffe0;
          iVar13 = local_1e8;
          while (lVar25 = local_170, iVar13 < local_1e0) {
            local_1dc = iVar13;
            local_1d8 = iVar13 << ((byte)local_248 & 0x1f);
            iVar13 = local_1e4;
            while (iVar13 < local_1d4) {
              local_1d0 = iVar13;
              iVar14 = av1_loop_restoration_corners_in_sb
                                 (local_258,(int)local_250,local_1d8,
                                  iVar13 << ((byte)local_248 & 0x1f),bsize,&rcol0,&rcol1,&rrow0,
                                  &rrow1);
              iVar13 = rrow0;
              if (iVar14 != 0) {
                for (; iVar13 < rrow1; iVar13 = iVar13 + 1) {
                  local_238 = iVar13 * (int)local_220;
                  local_234 = plane_h_2 - local_238;
                  if ((int)local_228 <= plane_h_2 - local_238) {
                    local_234 = (int)local_220;
                  }
                  local_234 = local_234 + local_238;
                  local_238 = local_238 - local_244;
                  if (local_238 < 1) {
                    local_238 = 0;
                  }
                  iVar14 = rcol0;
                  if (local_234 < plane_h_2) {
                    local_234 = local_234 - local_244;
                  }
                  for (; iVar14 < rcol1; iVar14 = iVar14 + 1) {
                    plane_w_1 = iVar14 * (int)local_220;
                    iVar17 = plane_h_1 - plane_w_1;
                    if ((int)local_228 <= plane_h_1 - plane_w_1) {
                      iVar17 = (int)local_220;
                    }
                    local_23c = iVar17 + plane_w_1;
                    iVar17 = local_1f8->horz_units;
                    local_f0 = 0;
                    pcVar22 = local_268;
                    for (lVar25 = 0; (ulong)(1 < iVar15) * 8 + 0x18 != lVar25; lVar25 = lVar25 + 8)
                    {
                      if (*pcVar22 == '\0') {
                        (**(code **)((long)&restoration_search_funs + lVar25))
                                  (&plane_w_1,iVar17 * iVar13 + iVar14,&plane_w,
                                   local_158->rst_tmpbuf,0,(cpi->common).error);
                      }
                      pcVar22 = pcVar22 + 1;
                    }
                  }
                }
              }
              iVar13 = local_1d0 + 1;
            }
            iVar13 = local_1dc + 1;
          }
        }
      }
      iVar15 = local_1f8->num_rest_units;
      dVar8 = 1.79769313486232e+308;
      for (lVar19 = 0; (ulong)(1 < iVar15) + 3 != lVar19; lVar19 = lVar19 + 1) {
        if ((local_268[lVar19] == '\0') &&
           (dVar27 = (double)(local_e8[lVar19] >>
                             ((char)((cpi->common).seq_params)->bit_depth * '\x02' - 0x10U & 0x3f))
                     * 128.0 + (double)(cpi->td).mb.rdmult * (double)(local_e8[lVar19 + 4] >> 4) *
                               0.001953125, dVar27 < dVar8)) {
          (&plane_h)[local_250] = (int)lVar19;
          dVar8 = dVar27;
        }
      }
      lVar25 = lVar25 + local_e8[(ulong)(uint)(&plane_h)[local_250] + 4];
      lVar19 = local_178 + local_e8[(uint)(&plane_h)[local_250]];
      uVar23 = local_250 + 1;
    }
    dVar8 = (double)(lVar19 >> ((char)((cpi->common).seq_params)->bit_depth * '\x02' - 0x10U & 0x3f)
                    ) * 128.0 + (double)(cpi->td).mb.rdmult * (double)(lVar25 >> 4) * 0.001953125;
    if (local_1a8 <= dVar8) break;
    bVar26 = true;
    for (uVar23 = local_1b8; uVar23 <= local_230; uVar23 = uVar23 + 1) {
      RVar4 = (&plane_h)[uVar23];
      pRVar24[uVar23].frame_restoration_type = RVar4;
      if (RVar4 != RESTORE_NONE) {
        uVar20 = (ulong)(uint)pRVar24[uVar23].num_rest_units;
        if (pRVar24[uVar23].num_rest_units < 1) {
          uVar20 = 0;
        }
        for (lVar25 = 0; uVar20 * 0x40 != lVar25; lVar25 = lVar25 + 0x40) {
          pRVar7 = (cpi->pick_lr_ctxt).rusi[uVar23];
          puVar2 = (undefined8 *)((long)(pRVar7->wiener).vfilter + lVar25);
          pRVar16 = pRVar24[uVar23].unit_info;
          iVar15 = *(int *)((ulong)(RVar4 - RESTORE_WIENER) * 4 + 0x2c + (long)puVar2);
          *(int *)((long)(pRVar16->wiener_info).vfilter + lVar25 + -0x10) = iVar15;
          if (iVar15 == 1) {
            uVar9 = *puVar2;
            uVar10 = puVar2[1];
            uVar11 = puVar2[3];
            puVar1 = (undefined8 *)((long)(pRVar16->wiener_info).hfilter + lVar25);
            *puVar1 = puVar2[2];
            puVar1[1] = uVar11;
            puVar2 = (undefined8 *)((long)(pRVar16->wiener_info).vfilter + lVar25);
            *puVar2 = uVar9;
            puVar2[1] = uVar10;
          }
          else {
            *(undefined4 *)((long)(pRVar16->sgrproj_info).xqd + lVar25 + 4) =
                 *(undefined4 *)((long)(pRVar7->sgrproj).xqd + lVar25 + 4);
            *(undefined8 *)((long)(pRVar16->sgrproj_info).xqd + lVar25 + -4) =
                 *(undefined8 *)((long)(pRVar7->sgrproj).xqd + lVar25 + -4);
          }
        }
        bVar26 = false;
      }
    }
    local_26c = uVar21;
    if (bVar26) break;
  }
  for (lVar25 = 0; local_208 != lVar25; lVar25 = lVar25 + 1) {
    set_restoration_unit_size(local_258,pRVar24,(uint)(lVar25 != 0),local_26c);
    pRVar24 = pRVar24 + 1;
  }
  if (((cpi->sf).lpf_sf.disable_wiener_filter == false) && ((char)local_264 == '\0')) {
    aom_free((cpi->pick_lr_ctxt).dgd_avg);
    (cpi->pick_lr_ctxt).dgd_avg = (int16_t *)0x0;
  }
  for (lVar25 = 0; local_208 != lVar25; lVar25 = lVar25 + 1) {
    aom_free((cpi->pick_lr_ctxt).rusi[lVar25]);
    (cpi->pick_lr_ctxt).rusi[lVar25] = (RestUnitSearchInfo *)0x0;
  }
  return;
}

Assistant:

void av1_pick_filter_restoration(const YV12_BUFFER_CONFIG *src, AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &cpi->td.mb;
  const SequenceHeader *const seq_params = cm->seq_params;
  const LOOP_FILTER_SPEED_FEATURES *lpf_sf = &cpi->sf.lpf_sf;
  const int num_planes = av1_num_planes(cm);
  const int highbd = cm->seq_params->use_highbitdepth;
  assert(!cm->features.all_lossless);

  av1_fill_lr_rates(&x->mode_costs, x->e_mbd.tile_ctx);

  // Select unit size based on speed feature settings, and allocate
  // rui structs based on this size
  int min_lr_unit_size = cpi->sf.lpf_sf.min_lr_unit_size;
  int max_lr_unit_size = cpi->sf.lpf_sf.max_lr_unit_size;

  // The minimum allowed unit size at a syntax level is 1 superblock.
  // Apply this constraint here so that the speed features code which sets
  // cpi->sf.lpf_sf.min_lr_unit_size does not need to know the superblock size
  min_lr_unit_size =
      AOMMAX(min_lr_unit_size, block_size_wide[cm->seq_params->sb_size]);

  max_lr_unit_size = AOMMAX(min_lr_unit_size, max_lr_unit_size);

  for (int plane = 0; plane < num_planes; ++plane) {
    cpi->pick_lr_ctxt.rusi[plane] = allocate_search_structs(
        cm, &cm->rst_info[plane], plane > 0, min_lr_unit_size);
  }

  x->rdmult = cpi->rd.RDMULT;

  // Allocate the frame buffer trial_frame_rst, which is used to temporarily
  // store the loop restored frame.
  if (aom_realloc_frame_buffer(
          &cpi->trial_frame_rst, cm->superres_upscaled_width,
          cm->superres_upscaled_height, seq_params->subsampling_x,
          seq_params->subsampling_y, highbd, AOM_RESTORATION_FRAME_BORDER,
          cm->features.byte_alignment, NULL, NULL, NULL, false, 0))
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate trial restored frame buffer");

  RestSearchCtxt rsc;

  // The buffers 'src_avg' and 'dgd_avg' are used to compute H and M buffers.
  // These buffers are only required for the AVX2 and NEON implementations of
  // av1_compute_stats. The buffer size required is calculated based on maximum
  // width and height of the LRU (i.e., from foreach_rest_unit_in_plane() 1.5
  // times the RESTORATION_UNITSIZE_MAX) allowed for Wiener filtering. The width
  // and height aligned to multiple of 16 is considered for intrinsic purpose.
  rsc.dgd_avg = NULL;
  rsc.src_avg = NULL;
#if HAVE_AVX2 || HAVE_NEON || HAVE_SVE
  // The buffers allocated below are used during Wiener filter processing.
  // Hence, allocate the same when Wiener filter is enabled. Make sure to
  // allocate these buffers only for the SIMD extensions that make use of them
  // (i.e. AVX2 for low bitdepth and NEON and SVE for low and high bitdepth).
#if HAVE_AVX2
  bool allocate_buffers = !cpi->sf.lpf_sf.disable_wiener_filter && !highbd;
#elif HAVE_NEON || HAVE_SVE
  bool allocate_buffers = !cpi->sf.lpf_sf.disable_wiener_filter;
#endif
  if (allocate_buffers) {
    const int buf_size = sizeof(*cpi->pick_lr_ctxt.dgd_avg) * 6 *
                         RESTORATION_UNITSIZE_MAX * RESTORATION_UNITSIZE_MAX;
    CHECK_MEM_ERROR(cm, cpi->pick_lr_ctxt.dgd_avg,
                    (int16_t *)aom_memalign(32, buf_size));

    rsc.dgd_avg = cpi->pick_lr_ctxt.dgd_avg;
    // When LRU width isn't multiple of 16, the 256 bits load instruction used
    // in AVX2 intrinsic can read data beyond valid LRU. Hence, in order to
    // silence Valgrind warning this buffer is initialized with zero. Overhead
    // due to this initialization is negligible since it is done at frame level.
    memset(rsc.dgd_avg, 0, buf_size);
    rsc.src_avg =
        rsc.dgd_avg + 3 * RESTORATION_UNITSIZE_MAX * RESTORATION_UNITSIZE_MAX;
    // Asserts the starting address of src_avg is always 32-bytes aligned.
    assert(!((intptr_t)rsc.src_avg % 32));
  }
#endif

  // Initialize all planes, so that any planes we skip searching will still have
  // valid data
  for (int plane = 0; plane < num_planes; plane++) {
    cm->rst_info[plane].frame_restoration_type = RESTORE_NONE;
  }

  // Decide which planes to search
  int plane_start, plane_end;

  if (lpf_sf->disable_loop_restoration_luma) {
    plane_start = AOM_PLANE_U;
  } else {
    plane_start = AOM_PLANE_Y;
  }

  if (num_planes == 1 || lpf_sf->disable_loop_restoration_chroma) {
    plane_end = AOM_PLANE_Y;
  } else {
    plane_end = AOM_PLANE_V;
  }

  // Derive the flags to enable/disable Loop restoration filters based on the
  // speed features 'disable_wiener_filter' and 'disable_sgr_filter'.
  bool disable_lr_filter[RESTORE_TYPES] = { false };
  av1_derive_flags_for_lr_processing(lpf_sf, disable_lr_filter);

  for (int plane = plane_start; plane <= plane_end; plane++) {
    const YV12_BUFFER_CONFIG *dgd = &cm->cur_frame->buf;
    const int is_uv = plane != AOM_PLANE_Y;
    int plane_w, plane_h;
    av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);
    av1_extend_frame(dgd->buffers[plane], plane_w, plane_h, dgd->strides[is_uv],
                     RESTORATION_BORDER, RESTORATION_BORDER, highbd);
  }

  double best_cost = DBL_MAX;
  int best_luma_unit_size = max_lr_unit_size;
  for (int luma_unit_size = max_lr_unit_size;
       luma_unit_size >= min_lr_unit_size; luma_unit_size >>= 1) {
    int64_t bits_this_size = 0;
    int64_t sse_this_size = 0;
    RestorationType best_rtype[MAX_MB_PLANE] = { RESTORE_NONE, RESTORE_NONE,
                                                 RESTORE_NONE };
    for (int plane = plane_start; plane <= plane_end; ++plane) {
      set_restoration_unit_size(cm, &cm->rst_info[plane], plane > 0,
                                luma_unit_size);
      init_rsc(src, &cpi->common, x, lpf_sf, plane,
               cpi->pick_lr_ctxt.rusi[plane], &cpi->trial_frame_rst, &rsc);

      restoration_search(cm, plane, &rsc, disable_lr_filter);

      const int plane_num_units = cm->rst_info[plane].num_rest_units;
      const RestorationType num_rtypes =
          (plane_num_units > 1) ? RESTORE_TYPES : RESTORE_SWITCHABLE_TYPES;
      double best_cost_this_plane = DBL_MAX;
      for (RestorationType r = 0; r < num_rtypes; ++r) {
        // Disable Loop restoration filter based on the flags set using speed
        // feature 'disable_wiener_filter' and 'disable_sgr_filter'.
        if (disable_lr_filter[r]) continue;

        double cost_this_plane = RDCOST_DBL_WITH_NATIVE_BD_DIST(
            x->rdmult, rsc.total_bits[r] >> 4, rsc.total_sse[r],
            cm->seq_params->bit_depth);

        if (cost_this_plane < best_cost_this_plane) {
          best_cost_this_plane = cost_this_plane;
          best_rtype[plane] = r;
        }
      }

      bits_this_size += rsc.total_bits[best_rtype[plane]];
      sse_this_size += rsc.total_sse[best_rtype[plane]];
    }

    double cost_this_size = RDCOST_DBL_WITH_NATIVE_BD_DIST(
        x->rdmult, bits_this_size >> 4, sse_this_size,
        cm->seq_params->bit_depth);

    if (cost_this_size < best_cost) {
      best_cost = cost_this_size;
      best_luma_unit_size = luma_unit_size;
      // Copy parameters out of rusi struct, before we overwrite it at
      // the start of the next iteration
      bool all_none = true;
      for (int plane = plane_start; plane <= plane_end; ++plane) {
        cm->rst_info[plane].frame_restoration_type = best_rtype[plane];
        if (best_rtype[plane] != RESTORE_NONE) {
          all_none = false;
          const int plane_num_units = cm->rst_info[plane].num_rest_units;
          for (int u = 0; u < plane_num_units; ++u) {
            copy_unit_info(best_rtype[plane], &cpi->pick_lr_ctxt.rusi[plane][u],
                           &cm->rst_info[plane].unit_info[u]);
          }
        }
      }
      // Heuristic: If all best_rtype entries are RESTORE_NONE, this means we
      // couldn't find any good filters at this size. So we likely won't find
      // any good filters at a smaller size either, so skip
      if (all_none) {
        break;
      }
    } else {
      // Heuristic: If this size is worse than the previous (larger) size, then
      // the next size down will likely be even worse, so skip
      break;
    }
  }

  // Final fixup to set the correct unit size
  // We set this for all planes, even ones we have skipped searching,
  // so that other code does not need to care which planes were and weren't
  // searched
  for (int plane = 0; plane < num_planes; ++plane) {
    set_restoration_unit_size(cm, &cm->rst_info[plane], plane > 0,
                              best_luma_unit_size);
  }

#if HAVE_AVX2 || HAVE_NEON || HAVE_SVE
#if HAVE_AVX2
  bool free_buffers = !cpi->sf.lpf_sf.disable_wiener_filter && !highbd;
#elif HAVE_NEON || HAVE_SVE
  bool free_buffers = !cpi->sf.lpf_sf.disable_wiener_filter;
#endif
  if (free_buffers) {
    aom_free(cpi->pick_lr_ctxt.dgd_avg);
    cpi->pick_lr_ctxt.dgd_avg = NULL;
  }
#endif
  for (int plane = 0; plane < num_planes; plane++) {
    aom_free(cpi->pick_lr_ctxt.rusi[plane]);
    cpi->pick_lr_ctxt.rusi[plane] = NULL;
  }
}